

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O3

void __thiscall Token::Token(Token *this,string *_content)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  char *pcVar4;
  undefined8 uVar5;
  ulong uVar6;
  runtime_error *this_00;
  long lVar7;
  Type TVar8;
  
  paVar1 = &(this->content).field_2;
  (this->content)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (_content->_M_dataplus)._M_p;
  paVar2 = &_content->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar5 = *(undefined8 *)((long)&_content->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->content).field_2 + 8) = uVar5;
  }
  else {
    (this->content)._M_dataplus._M_p = pcVar3;
    (this->content).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->content)._M_string_length = _content->_M_string_length;
  (_content->_M_dataplus)._M_p = (pointer)paVar2;
  _content->_M_string_length = 0;
  (_content->field_2)._M_local_buf[0] = '\0';
  for (uVar6 = std::__cxx11::string::find((char *)this,0x1f5092,0); uVar6 != 0xffffffffffffffff;
      uVar6 = std::__cxx11::string::find((char *)this,0x1f5092,uVar6 + 1)) {
    std::__cxx11::string::replace((ulong)this,uVar6,(char *)0x3,0x1ebe0d);
  }
  pcVar4 = (this->content)._M_dataplus._M_p;
  uVar6 = (this->content)._M_string_length;
  if (uVar6 < 5) {
LAB_0017e875:
    if ((uVar6 == 0) || (TVar8 = header, *pcVar4 != '<')) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"unknown token");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    lVar7 = 0;
    do {
      if ("std::"[lVar7] != pcVar4[lVar7]) goto LAB_0017e875;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 5);
    TVar8 = std;
    stripToken(this);
  }
  this->type = TVar8;
  return;
}

Assistant:

Token(std::string _content) :
            content(std::move(_content)) {
        str::replace_all(content, "%3A", ":");

        if (str::starts_with(content, "std::")) {
            stripToken();
            type = Type::std;
        } else if (str::starts_with(content, "<")) {
            type = Type::header;
        } else {
            throw std::runtime_error("unknown token");
        }
    }